

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_P256.c
# Opt level: O1

_Bool Hacl_P256_compressed_to_raw(uint8_t *pk,uint8_t *pk_raw)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  uint64_t uVar12;
  uint64_t uVar13;
  uint64_t uVar14;
  uint64_t uVar15;
  uint64_t t12;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  uint64_t t1_1;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  uint64_t t1;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  _Bool _Var30;
  uint64_t xa [4];
  uint64_t yM [4];
  uint64_t y2M [4];
  uint64_t xM [4];
  ulong local_118;
  ulong uStack_110;
  ulong local_108;
  ulong uStack_100;
  uint64_t local_f8;
  uint64_t uStack_f0;
  uint64_t local_e8;
  uint64_t uStack_e0;
  uint64_t local_d8;
  ulong uStack_d0;
  ulong local_c8;
  ulong uStack_c0;
  uint64_t local_b8;
  ulong uStack_b0;
  ulong local_a8;
  ulong uStack_a0;
  uint64_t local_98;
  ulong uStack_90;
  ulong local_88;
  ulong uStack_80;
  uint64_t local_78;
  ulong uStack_70;
  ulong local_68;
  ulong uStack_60;
  uint64_t local_58 [5];
  
  bVar1 = *pk;
  if ((bVar1 & 0xfe) == 2) {
    uVar16 = *(ulong *)(pk + 0x19);
    local_118 = uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
                (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
                (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 | (uVar16 & 0xff00) << 0x28
                | uVar16 << 0x38;
    uVar16 = *(ulong *)(pk + 0x11);
    uStack_110 = uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
                 (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
                 (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
                 (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38;
    uVar16 = *(ulong *)(pk + 9);
    local_108 = uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
                (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
                (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 | (uVar16 & 0xff00) << 0x28
                | uVar16 << 0x38;
    uVar16 = *(ulong *)(pk + 1);
    uStack_100 = uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
                 (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
                 (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
                 (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38;
    if (uStack_100 < 0xffffffff00000001 ||
        uStack_100 + 0xffffffff <
        (ulong)(local_108 <
               (uStack_110 < 0xffffffff ||
               uStack_110 - 0xffffffff < (ulong)(local_118 != 0xffffffffffffffff)))) {
      local_c8 = 0;
      uStack_c0 = 0;
      local_d8 = 0;
      uStack_d0 = 0;
      local_58[2] = 0;
      local_58[3] = 0;
      local_58[0] = 0;
      local_58[1] = 0;
      local_e8 = 0;
      uStack_e0 = 0;
      local_f8 = 0;
      uStack_f0 = 0;
      local_b8 = 3;
      uStack_b0 = 0xfffffffbffffffff;
      local_a8 = 0xfffffffffffffffe;
      uStack_a0 = 0x4fffffffd;
      fmul0(local_58,&local_118,&local_b8);
      local_68 = 0;
      uStack_60 = 0;
      local_78 = 0;
      uStack_70 = 0;
      fsqr0(&local_d8,local_58);
      fmul0(&local_d8,&local_d8,local_58);
      local_78 = 0xfffffffffffffffc;
      uStack_70 = 0x3ffffffff;
      local_68 = 0;
      uStack_60 = 0xfffffffc00000004;
      fmul0(&local_78,&local_78,local_58);
      uVar27 = local_78 + local_d8;
      uVar20 = uStack_70 + uStack_d0 + (ulong)CARRY8(local_78,local_d8);
      uVar16 = (ulong)(CARRY8(uStack_70,uStack_d0) ||
                      CARRY8(uStack_70 + uStack_d0,(ulong)CARRY8(local_78,local_d8)));
      uVar21 = local_68 + local_c8 + uVar16;
      uVar16 = (ulong)(CARRY8(local_68,local_c8) || CARRY8(local_68 + local_c8,uVar16));
      uVar22 = uStack_60 + uStack_c0 + uVar16;
      uVar23 = (ulong)(uVar20 < 0xffffffff ||
                      uVar20 - 0xffffffff < (ulong)(uVar27 != 0xffffffffffffffff));
      uVar28 = (ulong)(uVar21 < uVar23);
      uVar25 = (ulong)(CARRY8(uStack_60,uStack_c0) || CARRY8(uStack_60 + uStack_c0,uVar16)) -
               (ulong)(uVar22 < 0xffffffff00000001 || uVar22 + 0xffffffff < uVar28);
      uVar16 = ~uVar25;
      uVar19 = uVar27 + 1 & uVar16 | uVar27 & uVar25;
      uVar27 = (uVar20 - 0xffffffff) - (ulong)(uVar27 != 0xffffffffffffffff) & uVar16 |
               uVar20 & uVar25;
      uVar20 = uVar21 - uVar23 & uVar16 | uVar21 & uVar25;
      uVar25 = uVar16 & (uVar22 + 0xffffffff) - uVar28 | uVar25 & uVar22;
      local_78 = 0xd89cdf6229c4bddf;
      uStack_70 = 0xacf005cd78843090;
      local_68 = 0xe5a220abf7212ed6;
      uStack_60 = 0xdc30061d04874834;
      uVar16 = uVar27 + 0xacf005cd78843090;
      uVar22 = uVar16 + (0x2763209dd63b4220 < uVar19);
      uVar16 = (ulong)(0x530ffa32877bcf6f < uVar27 ||
                      CARRY8(uVar16,(ulong)(0x2763209dd63b4220 < uVar19)));
      uVar23 = uVar20 + 0xe5a220abf7212ed6;
      uVar21 = uVar23 + uVar16;
      uVar16 = (ulong)(0x1a5ddf5408ded129 < uVar20 || CARRY8(uVar23,uVar16));
      uVar23 = uVar25 + 0xdc30061d04874834;
      uVar17 = uVar23 + uVar16;
      uVar28 = (ulong)(uVar19 + 0xd89cdf6229c4bddf != 0xffffffffffffffff);
      uVar20 = (ulong)(uVar22 < 0xffffffff || uVar22 - 0xffffffff < uVar28);
      uVar27 = (ulong)(uVar21 < uVar20);
      uVar16 = (ulong)(0x23cff9e2fb78b7cb < uVar25 || CARRY8(uVar23,uVar16)) -
               (ulong)(uVar17 < 0xffffffff00000001 || uVar17 + 0xffffffff < uVar27);
      uVar25 = ~uVar16;
      uVar19 = uVar19 + 0xd89cdf6229c4bde0 & uVar25 | uVar19 + 0xd89cdf6229c4bddf & uVar16;
      uVar28 = (uVar22 - 0xffffffff) - uVar28 & uVar25 | uVar22 & uVar16;
      uVar23 = uVar21 - uVar20 & uVar25 | uVar21 & uVar16;
      uVar16 = uVar25 & (uVar17 + 0xffffffff) - uVar27 | uVar16 & uVar17;
      local_88 = 0;
      uStack_80 = 0;
      local_98 = 0;
      uStack_90 = 0;
      local_d8 = uVar19;
      uStack_d0 = uVar28;
      local_c8 = uVar23;
      uStack_c0 = uVar16;
      local_b8 = uVar19;
      uStack_b0 = uVar28;
      local_a8 = uVar23;
      uStack_a0 = uVar16;
      fsqr0(&local_b8,&local_b8);
      fmul0(&local_b8,&local_b8,&local_d8);
      local_88 = local_a8;
      uStack_80 = uStack_a0;
      local_98 = local_b8;
      uStack_90 = uStack_b0;
      fsqr0(&local_98,&local_98);
      fsqr0(&local_98,&local_98);
      fmul0(&local_98,&local_98,&local_b8);
      local_a8 = local_88;
      uStack_a0 = uStack_80;
      local_b8 = local_98;
      uStack_b0 = uStack_90;
      fsqr0(&local_b8,&local_b8);
      fsqr0(&local_b8,&local_b8);
      fsqr0(&local_b8,&local_b8);
      fsqr0(&local_b8,&local_b8);
      fmul0(&local_b8,&local_b8,&local_98);
      local_88 = local_a8;
      uStack_80 = uStack_a0;
      local_98 = local_b8;
      uStack_90 = uStack_b0;
      fsqr0(&local_98,&local_98);
      fsqr0(&local_98,&local_98);
      fsqr0(&local_98,&local_98);
      fsqr0(&local_98,&local_98);
      fsqr0(&local_98,&local_98);
      fsqr0(&local_98,&local_98);
      fsqr0(&local_98,&local_98);
      fsqr0(&local_98,&local_98);
      fmul0(&local_98,&local_98,&local_b8);
      local_a8 = local_88;
      uStack_a0 = uStack_80;
      local_b8 = local_98;
      uStack_b0 = uStack_90;
      fsqr0(&local_b8,&local_b8);
      fsqr0(&local_b8,&local_b8);
      fsqr0(&local_b8,&local_b8);
      fsqr0(&local_b8,&local_b8);
      fsqr0(&local_b8,&local_b8);
      fsqr0(&local_b8,&local_b8);
      fsqr0(&local_b8,&local_b8);
      fsqr0(&local_b8,&local_b8);
      fsqr0(&local_b8,&local_b8);
      fsqr0(&local_b8,&local_b8);
      fsqr0(&local_b8,&local_b8);
      fsqr0(&local_b8,&local_b8);
      fsqr0(&local_b8,&local_b8);
      fsqr0(&local_b8,&local_b8);
      fsqr0(&local_b8,&local_b8);
      fsqr0(&local_b8,&local_b8);
      fmul0(&local_b8,&local_b8,&local_98);
      local_88 = local_a8;
      uStack_80 = uStack_a0;
      local_98 = local_b8;
      uStack_90 = uStack_b0;
      iVar18 = 0x20;
      do {
        fsqr0(&local_98,&local_98);
        iVar18 = iVar18 + -1;
      } while (iVar18 != 0);
      fmul0(&local_98,&local_98,&local_d8);
      iVar18 = 0x60;
      do {
        fsqr0(&local_98,&local_98);
        iVar18 = iVar18 + -1;
      } while (iVar18 != 0);
      fmul0(&local_98,&local_98,&local_d8);
      iVar18 = 0x5e;
      do {
        fsqr0(&local_98,&local_98);
        iVar18 = iVar18 + -1;
      } while (iVar18 != 0);
      local_e8 = local_88;
      uStack_e0 = uStack_80;
      local_f8 = local_98;
      uStack_f0 = uStack_90;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_98;
      uVar21 = SUB168(auVar2 * ZEXT816(0xffffffff00000001),0);
      uVar22 = uVar21 + uStack_80;
      uVar17 = (local_98 << 0x20) + uStack_90;
      uVar20 = (ulong)CARRY8(local_98 << 0x20,uStack_90);
      uVar27 = (local_98 >> 0x20) + local_88;
      uVar26 = uVar27 + uVar20;
      uVar20 = (ulong)(CARRY8(local_98 >> 0x20,local_88) || CARRY8(uVar27,uVar20));
      uVar25 = uVar22 + uVar20;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = SUB168(auVar2 * ZEXT816(0xffffffff00000001),8) +
                     (ulong)CARRY8(uVar21,uStack_80) + (ulong)CARRY8(uVar22,uVar20);
      uVar21 = uVar17 >> 0x20;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar17;
      uVar22 = (uStack_90 << 0x20) + uVar26;
      uVar20 = (ulong)CARRY8(uStack_90 << 0x20,uVar26);
      uVar27 = uVar21 + uVar25;
      uVar29 = uVar27 + uVar20;
      auVar2 = auVar3 * ZEXT816(0xffffffff00000001) + auVar6 +
               ZEXT116(CARRY8(uVar21,uVar25) || CARRY8(uVar27,uVar20));
      uVar21 = auVar2._0_8_;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = auVar2._8_8_;
      uVar17 = uVar22 >> 0x20;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar22;
      uVar25 = (uVar26 << 0x20) + uVar29;
      uVar20 = (ulong)CARRY8(uVar26 << 0x20,uVar29);
      uVar27 = uVar17 + uVar21;
      uVar26 = uVar27 + uVar20;
      auVar2 = auVar4 * ZEXT816(0xffffffff00000001) + auVar7 +
               ZEXT116(CARRY8(uVar17,uVar21) || CARRY8(uVar27,uVar20));
      uVar21 = auVar2._0_8_;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = auVar2._8_8_;
      uVar22 = uVar25 >> 0x20;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar25;
      uVar24 = (uVar29 << 0x20) + uVar26;
      uVar20 = (ulong)CARRY8(uVar29 << 0x20,uVar26);
      uVar27 = uVar22 + uVar21;
      uVar25 = uVar27 + uVar20;
      auVar2 = auVar5 * ZEXT816(0xffffffff00000001) + auVar8 +
               ZEXT116(CARRY8(uVar22,uVar21) || CARRY8(uVar27,uVar20));
      uVar21 = auVar2._0_8_;
      uVar22 = auVar2._8_8_;
      uVar20 = (ulong)(uVar25 < 0xffffffff ||
                      uVar25 - 0xffffffff < (ulong)(uVar24 != 0xffffffffffffffff));
      uVar27 = (ulong)(uVar21 < uVar20);
      uVar29 = (ulong)(uVar22 < 0xffffffff00000001 || uVar22 + 0xffffffff < uVar27);
      uVar26 = -uVar29;
      uVar29 = uVar29 - 1;
      uVar17 = uVar24 + 1 & uVar29 | uVar24 & uVar26;
      uVar25 = (uVar25 - 0xffffffff) - (ulong)(uVar24 != 0xffffffffffffffff) & uVar29 |
               uVar25 & uVar26;
      uVar20 = uVar21 - uVar20 & uVar29 | uVar21 & uVar26;
      uVar27 = uVar29 & (uVar22 + 0xffffffff) - uVar27 | uVar26 & uVar22;
      fsqr0(&local_f8,&local_f8);
      uVar12 = FStar_UInt64_eq_mask(local_f8,uVar19);
      uVar13 = FStar_UInt64_eq_mask(uStack_f0,uVar28);
      uVar14 = FStar_UInt64_eq_mask(local_e8,uVar23);
      uVar15 = FStar_UInt64_eq_mask(uStack_e0,uVar16);
      _Var30 = (uVar15 & uVar14 & uVar13 & uVar12) == 0xffffffffffffffff;
      if ((_Var30) && (((bVar1 == 3 ^ (byte)uVar17) & 1) != 0)) {
        uVar22 = -uVar17;
        uVar21 = -uVar25 - (ulong)(uVar17 != 0);
        uVar16 = (ulong)(uVar25 != 0 || -uVar25 < (ulong)(uVar17 != 0));
        uVar19 = -uVar20 - uVar16;
        uVar23 = (ulong)(uVar20 != 0 || -uVar20 < uVar16);
        uVar28 = -uVar27 - uVar23;
        uVar16 = (ulong)(0xffffffff00000000 < uVar21 ||
                        CARRY8(uVar21 + 0xffffffff,(ulong)(uVar22 != 0)));
        uVar27 = (ulong)(uVar27 != 0 || -uVar27 < uVar23);
        uVar23 = -uVar27;
        uVar27 = uVar27 - 1;
        uVar17 = uVar22 & uVar27 | uVar22 - 1 & uVar23;
        uVar25 = uVar21 & uVar27 | uVar21 + 0xffffffff + (ulong)(uVar22 != 0) & uVar23;
        uVar20 = uVar19 & uVar27 | uVar19 + uVar16 & uVar23;
        uVar27 = uVar27 & uVar28 | uVar23 & (uVar28 - 0xffffffff) + (ulong)CARRY8(uVar19,uVar16);
      }
      goto LAB_0014b334;
    }
  }
  uVar17 = 0;
  uVar25 = 0;
  uVar20 = 0;
  uVar27 = 0;
  _Var30 = false;
LAB_0014b334:
  if (_Var30 != false) {
    uVar9 = *(undefined8 *)(pk + 1);
    uVar10 = *(undefined8 *)(pk + 9);
    uVar11 = *(undefined8 *)(pk + 0x19);
    *(undefined8 *)(pk_raw + 0x10) = *(undefined8 *)(pk + 0x11);
    *(undefined8 *)(pk_raw + 0x18) = uVar11;
    *(undefined8 *)pk_raw = uVar9;
    *(undefined8 *)(pk_raw + 8) = uVar10;
    *(ulong *)(pk_raw + 0x20) =
         uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 | (uVar27 & 0xff0000000000) >> 0x18 |
         (uVar27 & 0xff00000000) >> 8 | (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
         (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38;
    *(ulong *)(pk_raw + 0x28) =
         uVar20 >> 0x38 | (uVar20 & 0xff000000000000) >> 0x28 | (uVar20 & 0xff0000000000) >> 0x18 |
         (uVar20 & 0xff00000000) >> 8 | (uVar20 & 0xff000000) << 8 | (uVar20 & 0xff0000) << 0x18 |
         (uVar20 & 0xff00) << 0x28 | uVar20 << 0x38;
    *(ulong *)(pk_raw + 0x30) =
         uVar25 >> 0x38 | (uVar25 & 0xff000000000000) >> 0x28 | (uVar25 & 0xff0000000000) >> 0x18 |
         (uVar25 & 0xff00000000) >> 8 | (uVar25 & 0xff000000) << 8 | (uVar25 & 0xff0000) << 0x18 |
         (uVar25 & 0xff00) << 0x28 | uVar25 << 0x38;
    *(ulong *)(pk_raw + 0x38) =
         uVar17 >> 0x38 | (uVar17 & 0xff000000000000) >> 0x28 | (uVar17 & 0xff0000000000) >> 0x18 |
         (uVar17 & 0xff00000000) >> 8 | (uVar17 & 0xff000000) << 8 | (uVar17 & 0xff0000) << 0x18 |
         (uVar17 & 0xff00) << 0x28 | uVar17 << 0x38;
  }
  return _Var30;
}

Assistant:

bool Hacl_P256_compressed_to_raw(uint8_t *pk, uint8_t *pk_raw)
{
  uint64_t xa[4U] = { 0U };
  uint64_t ya[4U] = { 0U };
  uint8_t *pk_xb = pk + 1U;
  bool b = aff_point_decompress_vartime(xa, ya, pk);
  if (b)
  {
    memcpy(pk_raw, pk_xb, 32U * sizeof (uint8_t));
    bn_to_bytes_be4(pk_raw + 32U, ya);
  }
  return b;
}